

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StatsBind(ClientContext *context,ScalarFunction *bound_function,
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *arguments)

{
  element_type *peVar1;
  
  peVar1 = (element_type *)operator_new(0x28);
  *(undefined ***)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
       &PTR__StatsBindData_0247a568;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&(peVar1->db).internal + 8);
  *(undefined1 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(peVar1->db).internal + 8))->_M_pi = 0;
  (peVar1->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = 0;
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> StatsBind(ClientContext &context, ScalarFunction &bound_function,
                                   vector<unique_ptr<Expression>> &arguments) {
	return make_uniq<StatsBindData>();
}